

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qbitarray.cpp
# Opt level: O2

QDebug operator<<(QDebug dbg,QBitArray *array)

{
  long lVar1;
  Data *pDVar2;
  char *pcVar3;
  char *pcVar4;
  long in_RDX;
  ulong uVar5;
  long in_FS_OFFSET;
  QDebugStateSaver saver;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  saver.d._M_t.
  super___uniq_ptr_impl<QDebugStateSaverPrivate,_std::default_delete<QDebugStateSaverPrivate>_>._M_t
  .super__Tuple_impl<0UL,_QDebugStateSaverPrivate_*,_std::default_delete<QDebugStateSaverPrivate>_>.
  super__Head_base<0UL,_QDebugStateSaverPrivate_*,_false>._M_head_impl =
       (unique_ptr<QDebugStateSaverPrivate,_std::default_delete<QDebugStateSaverPrivate>_>)
       &DAT_aaaaaaaaaaaaaaaa;
  QDebugStateSaver::QDebugStateSaver(&saver,(QDebug *)array);
  *(undefined1 *)&(array->d).d.d[3].super_QArrayData.ref_._q_value.super___atomic_base<int> = 0;
  QDebug::operator<<((QDebug *)array,"QBitArray(");
  uVar5 = 0;
  while( true ) {
    pcVar3 = *(char **)(in_RDX + 8);
    pcVar4 = pcVar3;
    if (pcVar3 == (char *)0x0) {
      pcVar4 = &QByteArray::_empty;
    }
    if (*(long *)(in_RDX + 0x10) * 8 - (long)*pcVar4 <= (long)uVar5) break;
    QDebug::operator<<((QDebug *)array,
                       (((byte)pcVar3[(uVar5 >> 3) + 1] >> ((uint)uVar5 & 7) & 1) != 0) + '0');
    uVar5 = uVar5 + 1;
    if ((uVar5 & 3) == 0) {
      pcVar3 = *(char **)(in_RDX + 8);
      if (pcVar3 == (char *)0x0) {
        pcVar3 = &QByteArray::_empty;
      }
      if ((long)uVar5 < *(long *)(in_RDX + 0x10) * 8 - (long)*pcVar3) {
        QDebug::operator<<((QDebug *)array,' ');
      }
    }
  }
  QDebug::operator<<((QDebug *)array,')');
  pDVar2 = (array->d).d.d;
  (array->d).d.d = (Data *)0x0;
  ((dbg.stream)->ts)._vptr_QTextStream = (_func_int **)pDVar2;
  QDebugStateSaver::~QDebugStateSaver(&saver);
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return (QDebug)dbg.stream;
  }
  __stack_chk_fail();
}

Assistant:

QDebug operator<<(QDebug dbg, const QBitArray &array)
{
    QDebugStateSaver saver(dbg);
    dbg.nospace() << "QBitArray(";
    for (qsizetype i = 0; i < array.size();) {
        if (array.testBit(i))
            dbg << '1';
        else
            dbg << '0';
        i += 1;
        if (!(i % 4) && (i < array.size()))
            dbg << ' ';
    }
    dbg << ')';
    return dbg;
}